

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

Event * ftxui::Event::Mouse(Event *__return_storage_ptr__,string *input,Mouse mouse)

{
  Mouse MVar1;
  string *input_local;
  Event *event;
  
  MVar1 = mouse;
  Event(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input_,(string *)input);
  __return_storage_ptr__->type_ = Mouse;
  *(int *)&__return_storage_ptr__->field_1 = mouse.button;
  *(Motion *)((long)&__return_storage_ptr__->field_1 + 4) = mouse.motion;
  mouse._8_8_ = MVar1._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = mouse._8_8_;
  mouse.y = MVar1.y;
  (__return_storage_ptr__->field_1).mouse_.y = mouse.y;
  return __return_storage_ptr__;
}

Assistant:

Event Event::Mouse(std::string input, struct Mouse mouse) {
  Event event;
  event.input_ = std::move(input);
  event.type_ = Type::Mouse;
  event.mouse_ = mouse;
  return event;
}